

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

FOTerm * test_create_program(void)

{
  string *vname;
  undefined1 auVar1 [16];
  long lVar2;
  FOTerm *in_RDI;
  ulong in_R8;
  long *plVar3;
  initializer_list<FOTerm> params;
  initializer_list<FOTerm> params_00;
  initializer_list<FOTerm> params_01;
  initializer_list<FOTerm> params_02;
  undefined1 local_358 [8];
  FOTerm X;
  FOTerm a;
  FOTerm fa;
  FOTerm fX;
  FOTerm hYfa;
  long local_208;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  vector<FOTerm,_std::allocator<FOTerm>_> local_1b8;
  undefined4 local_1a0;
  long *local_198 [2];
  long local_188 [2];
  vector<FOTerm,_std::allocator<FOTerm>_> local_178;
  undefined4 local_160;
  long *local_158 [2];
  long local_148 [2];
  undefined1 local_138 [8];
  FOTerm Y;
  long local_e8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  vname = (string *)((long)&hYfa.name.field_2 + 8);
  hYfa.name.field_2._8_8_ = &stack0xfffffffffffffdf8;
  local_38._M_p = (pointer)in_RDI;
  std::__cxx11::string::_M_construct<char_const*>((string *)vname,"X","");
  FOTerm::variable((FOTerm *)local_358,vname);
  if ((long *)hYfa.name.field_2._8_8_ != &stack0xfffffffffffffdf8) {
    operator_delete((void *)hYfa.name.field_2._8_8_,local_208 + 1);
  }
  Y.name.field_2._8_8_ = &stack0xffffffffffffff18;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&Y.name.field_2 + 8),"Y","");
  FOTerm::variable((FOTerm *)local_138,(string *)((long)&Y.name.field_2 + 8));
  if ((long *)Y.name.field_2._8_8_ != &stack0xffffffffffffff18) {
    operator_delete((void *)Y.name.field_2._8_8_,local_e8 + 1);
  }
  local_d8._0_8_ = (pointer)(local_d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"a","");
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8;
  FOTerm::functor((FOTerm *)((long)&X.name.field_2 + 8),(FOTerm *)local_d8,(string *)0x0,
                  (initializer_list<FOTerm>)(auVar1 << 0x40));
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&(((vector<FOTerm,_std::allocator<FOTerm>_> *)local_d8._16_8_)->
                                   super__Vector_base<FOTerm,_std::allocator<FOTerm>_>)._M_impl.
                                   super__Vector_impl_data._M_start + 1));
  }
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"f","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&X.name.field_2 + 8));
  local_1f8.field_2._8_4_ =
       a.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,a._24_8_,a.name._M_dataplus._M_p + a._24_8_);
  params._M_len = in_R8;
  params._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&a.name.field_2 + 8),(FOTerm *)local_b8,&local_1f8,params);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"f","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)local_358);
  local_1f8.field_2._8_4_ =
       X.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,X._24_8_,X.name._M_dataplus._M_p + X._24_8_);
  params_00._M_len = in_R8;
  params_00._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&fa.name.field_2 + 8),(FOTerm *)local_98,&local_1f8,params_00);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"h","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)local_138);
  local_1f8.field_2._8_4_ =
       Y.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,Y._24_8_,Y.name._M_dataplus._M_p + Y._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_1b8,(vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&a.name.field_2 + 8));
  local_1a0 = fa.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  plVar3 = local_188;
  local_198[0] = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,fa._24_8_,fa.name._M_dataplus._M_p + fa._24_8_);
  params_01._M_len = in_R8;
  params_01._M_array = (iterator)0x2;
  FOTerm::functor((FOTerm *)((long)&fX.name.field_2 + 8),(FOTerm *)local_78,&local_1f8,params_01);
  lVar2 = -0x80;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
              ((vector<FOTerm,_std::allocator<FOTerm>_> *)(plVar3 + -6));
    plVar3 = plVar3 + -8;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"p","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f8,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fa.name.field_2 + 8));
  local_1f8.field_2._8_4_ =
       fX.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._0_4_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,fX._24_8_,fX.name._M_dataplus._M_p + fX._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_1b8,(vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fX.name.field_2 + 8));
  local_1a0 = hYfa.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,hYfa._24_8_,hYfa.name._M_dataplus._M_p + hYfa._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_178,(vector<FOTerm,_std::allocator<FOTerm>_> *)local_138);
  local_160 = Y.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  plVar3 = local_148;
  local_158[0] = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,Y._24_8_,Y.name._M_dataplus._M_p + Y._24_8_);
  params_02._M_len = in_R8;
  params_02._M_array = (iterator)0x3;
  FOTerm::functor((FOTerm *)local_38._M_p,(FOTerm *)&local_58,&local_1f8,params_02);
  lVar2 = -0xc0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
              ((vector<FOTerm,_std::allocator<FOTerm>_> *)(plVar3 + -6));
    plVar3 = plVar3 + -8;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((size_type *)hYfa._24_8_ != &hYfa.name._M_string_length) {
    operator_delete((void *)hYfa._24_8_,hYfa.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fX.name.field_2 + 8));
  if ((size_type *)fX._24_8_ != &fX.name._M_string_length) {
    operator_delete((void *)fX._24_8_,fX.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fa.name.field_2 + 8));
  if ((size_type *)fa._24_8_ != &fa.name._M_string_length) {
    operator_delete((void *)fa._24_8_,fa.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&a.name.field_2 + 8));
  if ((size_type *)a._24_8_ != &a.name._M_string_length) {
    operator_delete((void *)a._24_8_,a.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&X.name.field_2 + 8));
  if ((size_type *)Y._24_8_ != &Y.name._M_string_length) {
    operator_delete((void *)Y._24_8_,Y.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_138);
  if ((size_type *)X._24_8_ != &X.name._M_string_length) {
    operator_delete((void *)X._24_8_,X.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_358);
  return (FOTerm *)local_38._M_p;
}

Assistant:

FOTerm test_create_program() {
    FOTerm X = FOTerm::variable("X");
    FOTerm Y = FOTerm::variable("Y");
    FOTerm a = FOTerm::functor("a", {});
    FOTerm fa = FOTerm::functor("f", {a});
    FOTerm fX = FOTerm::functor("f", {X});
    FOTerm hYfa = FOTerm::functor("h", {Y, fa});
    return FOTerm::functor("p", {fX, hYfa, Y});
}